

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_lzop.c
# Opt level: O3

void test_write_filter_lzop(void)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  archive *paVar4;
  void *pvVar5;
  char *pcVar6;
  archive_entry *entry;
  la_ssize_t lVar7;
  la_int64_t lVar8;
  ulong uVar9;
  longlong lVar10;
  uint uVar11;
  archive_entry *ae;
  size_t used2;
  size_t used1;
  char path [16];
  archive_entry *local_80;
  int local_74;
  void *local_70;
  uint local_68;
  undefined4 uStack_64;
  void *local_60;
  longlong local_58;
  uint local_50;
  undefined4 uStack_4c;
  char local_48 [24];
  
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'*',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_add_filter_lzop(paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  lVar10 = 0;
  if (iVar1 != 0) {
    wVar3 = canLzop();
    lVar10 = -0x14;
    if (wVar3 == L'\0' || iVar1 != -0x14) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'1');
      test_skipping("lzop writing not supported on this platform");
      return;
    }
  }
  local_74 = iVar1;
  pvVar5 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'7',(uint)(pvVar5 != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  local_60 = calloc(10000,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L':',(uint)(local_60 != (void *)0x0),"NULL != (data = calloc(datasize, 1))",
                   (void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'@',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_add_filter_lzop(paVar4);
  local_58 = lVar10;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'C',lVar10,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                      "archive_write_add_filter_lzop(a)",paVar4);
  iVar1 = archive_write_set_bytes_per_block(paVar4,0x400);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 1024)",
                      paVar4);
  iVar1 = archive_write_set_bytes_in_last_block(paVar4,0x400);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'G',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_bytes_in_last_block(a, 1024)",paVar4);
  iVar1 = archive_filter_code(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'H',0xb,"ARCHIVE_FILTER_LZOP",(long)iVar1,"archive_filter_code(a, 0)",
                      (void *)0x0);
  pcVar6 = archive_filter_name(paVar4,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
             ,L'I',"lzop","\"lzop\"",pcVar6,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
  local_70 = pvVar5;
  iVar1 = archive_write_open_memory(paVar4,pvVar5,2000000,(size_t *)&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
  entry = archive_entry_new();
  local_80 = entry;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'L',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_filetype(entry,0x8000);
  archive_entry_set_size(entry,10000);
  uVar9 = 0;
  do {
    snprintf(local_48,0x10,"file%03d",uVar9);
    archive_entry_copy_pathname(entry,local_48);
    iVar1 = archive_write_header(paVar4,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'R',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
    lVar7 = archive_write_data(paVar4,local_60,10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'T',(uint)(lVar7 == 10000),
                     "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
    uVar11 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar11;
  } while (uVar11 != 10);
  archive_entry_free(entry);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'W',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'Z',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'[',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_lzop(paVar4);
  if ((local_74 == 0) && (iVar1 == -0x14)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'^');
    test_skipping(
                 "Can\'t verify lzop writing by reading back; lzop reading not fully supported on this platform"
                 );
  }
  else {
    iVar1 = archive_read_open_memory(paVar4,local_70,CONCAT44(uStack_4c,local_50));
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used1)",
                        paVar4);
    uVar9 = 0;
    do {
      snprintf(local_48,0x10,"file%03d",uVar9);
      iVar1 = archive_read_next_header(paVar4,&local_80);
      wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                                  ,L'f',0,"ARCHIVE_OK",(long)iVar1,
                                  "archive_read_next_header(a, &ae)",(void *)0x0);
      if (wVar3 == L'\0') break;
      pcVar6 = archive_entry_pathname(local_80);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                 ,L'h',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar8 = archive_entry_size(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                          ,L'i',10000,"(int)datasize",lVar8,"archive_entry_size(ae)",(void *)0x0);
      uVar11 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar11;
    } while (uVar11 != 10);
    iVar1 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  }
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L's',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L't',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_set_bytes_per_block(paVar4,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'v',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 10)",
                      paVar4);
  iVar1 = archive_write_add_filter_lzop(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'x',local_58,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                      "archive_write_add_filter_lzop(a)",paVar4);
  iVar1 = archive_write_set_options(paVar4,"lzop:nonexistent-option=0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'z',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                      "archive_write_set_options(a, \"lzop:nonexistent-option=0\")",paVar4);
  iVar1 = archive_write_set_options(paVar4,"lzop:compression-level=1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_options(a, \"lzop:compression-level=1\")",paVar4);
  iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","9");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")",
                      paVar4);
  iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","abc");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x80',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")",
                      paVar4);
  iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","99");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x82',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")",
                      paVar4);
  iVar1 = archive_write_set_options(paVar4,"lzop:compression-level=9");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_options(a, \"lzop:compression-level=9\")",paVar4);
  iVar1 = archive_write_open_memory(paVar4,local_70,2000000,(size_t *)&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
  pvVar5 = local_60;
  uVar9 = 0;
  do {
    snprintf(local_48,0x10,"file%03d",uVar9);
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'\x89',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(local_80,local_48);
    archive_entry_set_size(local_80,10000);
    archive_entry_set_filetype(local_80,0x8000);
    iVar1 = archive_write_header(paVar4,local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'\x8d',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
    lVar7 = archive_write_data(paVar4,pvVar5,10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'\x8f',(uint)(lVar7 == 10000),
                     "datasize == (size_t)archive_write_data( a, data, datasize)",paVar4);
    archive_entry_free(local_80);
    uVar11 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar11;
  } while (uVar11 != 10);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x92',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x93',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  failure("compression-level=9 wrote %d bytes, default wrote %d bytes",(ulong)local_68,
          (ulong)local_50);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'\x97',(uint)(CONCAT44(uStack_64,local_68) < CONCAT44(uStack_4c,local_50)),
                   "used2 < used1",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'\x99',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x9a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                      paVar4);
  iVar1 = archive_read_support_filter_lzop(paVar4);
  if ((local_74 == 0) && (iVar1 != 0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'\x9d');
    test_skipping("lzop reading not fully supported on this platform");
  }
  else {
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'\xa0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar4);
    iVar1 = archive_read_open_memory(paVar4,local_70,CONCAT44(uStack_64,local_68));
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'¢',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used2)"
                        ,paVar4);
    uVar9 = 0;
    do {
      snprintf(local_48,0x10,"file%03d",uVar9);
      iVar1 = archive_read_next_header(paVar4,&local_80);
      wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                                  ,L'¦',0,"ARCHIVE_OK",(long)iVar1,
                                  "archive_read_next_header(a, &ae)",(void *)0x0);
      if (wVar3 == L'\0') break;
      pcVar6 = archive_entry_pathname(local_80);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                 ,L'¨',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar8 = archive_entry_size(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                          ,L'©',10000,"(int)datasize",lVar8,"archive_entry_size(ae)",(void *)0x0);
      uVar11 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar11;
    } while (uVar11 != 10);
    iVar1 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'«',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  }
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'­',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'²',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'³',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_set_bytes_per_block(paVar4,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'µ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 10)",
                      paVar4);
  iVar1 = archive_write_add_filter_lzop(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'·',local_58,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                      "archive_write_add_filter_lzop(a)",paVar4);
  iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'¹',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"1\")",
                      paVar4);
  iVar1 = archive_write_open_memory(paVar4,local_70,2000000,(size_t *)&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'»',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
  pvVar5 = local_60;
  uVar9 = 0;
  do {
    snprintf(local_48,0x10,"file%03d",uVar9);
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'¾',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(local_80,local_48);
    archive_entry_set_size(local_80,10000);
    archive_entry_set_filetype(local_80,0x8000);
    iVar1 = archive_write_header(paVar4,local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'Â',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
    failure("Writing file %s",local_48);
    lVar7 = archive_write_data(paVar4,pvVar5,10000);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'Å',10000,"datasize",lVar7,
                        "(size_t)archive_write_data(a, data, datasize)",paVar4);
    archive_entry_free(local_80);
    uVar11 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar11;
  } while (uVar11 != 10);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'È',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'É',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'Ñ',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'Ò',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'Ó',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_lzop(paVar4);
  if ((local_74 == 0) && (iVar1 == -0x14)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'Ö');
    test_skipping("lzop reading not fully supported on this platform");
  }
  else {
    iVar1 = archive_read_open_memory(paVar4,local_70,CONCAT44(uStack_64,local_68));
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'Ù',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used2)"
                        ,paVar4);
    uVar9 = 0;
    do {
      snprintf(local_48,0x10,"file%03d",uVar9);
      iVar1 = archive_read_next_header(paVar4,&local_80);
      wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                                  ,L'Ý',0,"ARCHIVE_OK",(long)iVar1,
                                  "archive_read_next_header(a, &ae)",(void *)0x0);
      if (wVar3 == L'\0') break;
      pcVar6 = archive_entry_pathname(local_80);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                 ,L'ß',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar8 = archive_entry_size(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                          ,L'à',10000,"(int)datasize",lVar8,"archive_entry_size(ae)",(void *)0x0);
      uVar11 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar11;
    } while (uVar11 != 10);
    iVar1 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'â',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  }
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ä',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'ê',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_add_filter_lzop(paVar4);
  lVar10 = local_58;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ì',local_58,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                      "archive_write_add_filter_lzop(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'í',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'ï',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_add_filter_lzop(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ñ',lVar10,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                      "archive_write_add_filter_lzop(a)",paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ò',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ó',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'õ',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ö',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_add_filter_lzop(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ø',lVar10,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                      "archive_write_add_filter_lzop(a)",paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ù',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ú',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'ü',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ý',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_add_filter_lzop(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ÿ',lVar10,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                      "archive_write_add_filter_lzop(a)",paVar4);
  pvVar5 = local_70;
  iVar1 = archive_write_open_memory(paVar4,local_70,2000000,(size_t *)&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ā',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'Ă',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ă',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  free(local_60);
  free(pvVar5);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_lzop)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r, use_prog = 0, filecount;

	assert((a = archive_write_new()) != NULL);
	r = archive_write_add_filter_lzop(a);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	if (r != ARCHIVE_OK) {
		if (canLzop() && r == ARCHIVE_WARN)
			use_prog = 1;
		else {
			skipping("lzop writing not supported on this platform");
			return;
		}
	}

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = calloc(datasize, 1)));
	filecount = 10;

	/*
	 * Write a filecount files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 1024));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_in_last_block(a, 1024));
	assertEqualInt(ARCHIVE_FILTER_LZOP, archive_filter_code(a, 0));
	assertEqualString("lzop", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lzop(a);
	if (r == ARCHIVE_WARN && !use_prog) {
		skipping("Can't verify lzop writing by reading back;"
		    " lzop reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < filecount; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_options(a, "lzop:nonexistent-option=0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "lzop:compression-level=1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "lzop:compression-level=9"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(
		    a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	failure("compression-level=9 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lzop(a);
	if (r != ARCHIVE_OK && !use_prog) {
		skipping("lzop reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < filecount; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

#if 0
	failure("Compression-level=1 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);
#endif

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_lzop(a);
	if (r == ARCHIVE_WARN && !use_prog) {
		skipping("lzop reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < filecount; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}